

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O3

void __thiscall
submitblock_StateCatcher::BlockChecked
          (submitblock_StateCatcher *this,CBlock *block,BlockValidationState *stateIn)

{
  BlockValidationResult BVar1;
  long in_FS_OFFSET;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint256 local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::GetHash(&local_40,&block->super_CBlockHeader);
  auVar3[0] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0] ==
               local_40.super_base_blob<256U>.m_data._M_elems[0]);
  auVar3[1] = -((this->hash).super_base_blob<256U>.m_data._M_elems[1] ==
               local_40.super_base_blob<256U>.m_data._M_elems[1]);
  auVar3[2] = -((this->hash).super_base_blob<256U>.m_data._M_elems[2] ==
               local_40.super_base_blob<256U>.m_data._M_elems[2]);
  auVar3[3] = -((this->hash).super_base_blob<256U>.m_data._M_elems[3] ==
               local_40.super_base_blob<256U>.m_data._M_elems[3]);
  auVar3[4] = -((this->hash).super_base_blob<256U>.m_data._M_elems[4] ==
               local_40.super_base_blob<256U>.m_data._M_elems[4]);
  auVar3[5] = -((this->hash).super_base_blob<256U>.m_data._M_elems[5] ==
               local_40.super_base_blob<256U>.m_data._M_elems[5]);
  auVar3[6] = -((this->hash).super_base_blob<256U>.m_data._M_elems[6] ==
               local_40.super_base_blob<256U>.m_data._M_elems[6]);
  auVar3[7] = -((this->hash).super_base_blob<256U>.m_data._M_elems[7] ==
               local_40.super_base_blob<256U>.m_data._M_elems[7]);
  auVar3[8] = -((this->hash).super_base_blob<256U>.m_data._M_elems[8] ==
               local_40.super_base_blob<256U>.m_data._M_elems[8]);
  auVar3[9] = -((this->hash).super_base_blob<256U>.m_data._M_elems[9] ==
               local_40.super_base_blob<256U>.m_data._M_elems[9]);
  auVar3[10] = -((this->hash).super_base_blob<256U>.m_data._M_elems[10] ==
                local_40.super_base_blob<256U>.m_data._M_elems[10]);
  auVar3[0xb] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0xb] ==
                 local_40.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar3[0xc] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0xc] ==
                 local_40.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar3[0xd] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0xd] ==
                 local_40.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar3[0xe] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0xe] ==
                 local_40.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar3[0xf] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0xf] ==
                 local_40.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar2[0] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x10] ==
               local_40.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar2[1] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x11] ==
               local_40.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar2[2] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x12] ==
               local_40.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar2[3] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x13] ==
               local_40.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar2[4] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x14] ==
               local_40.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar2[5] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x15] ==
               local_40.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar2[6] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x16] ==
               local_40.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar2[7] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x17] ==
               local_40.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar2[8] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x18] ==
               local_40.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar2[9] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x19] ==
               local_40.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar2[10] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                local_40.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar2[0xb] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                 local_40.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar2[0xc] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                 local_40.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar2[0xd] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                 local_40.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar2[0xe] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                 local_40.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar2[0xf] = -((this->hash).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                 local_40.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar2 = auVar2 & auVar3;
  if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) == 0xffff) {
    this->found = true;
    BVar1 = (stateIn->super_ValidationState<BlockValidationResult>).m_result;
    (this->state).super_ValidationState<BlockValidationResult>.m_mode =
         (stateIn->super_ValidationState<BlockValidationResult>).m_mode;
    (this->state).super_ValidationState<BlockValidationResult>.m_result = BVar1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&(this->state).super_ValidationState<BlockValidationResult>.m_reject_reason,
               &(stateIn->super_ValidationState<BlockValidationResult>).m_reject_reason);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&(this->state).super_ValidationState<BlockValidationResult>.m_debug_message,
               &(stateIn->super_ValidationState<BlockValidationResult>).m_debug_message);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockChecked(const CBlock& block, const BlockValidationState& stateIn) override {
        if (block.GetHash() != hash)
            return;
        found = true;
        state = stateIn;
    }